

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_BackslashQuoteUnterminated_Test::~JsonString_BackslashQuoteUnterminated_Test
          (JsonString_BackslashQuoteUnterminated_Test *this)

{
  JsonString_BackslashQuoteUnterminated_Test *this_local;
  
  ~JsonString_BackslashQuoteUnterminated_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, BackslashQuoteUnterminated) {
    auto p = json::make_parser (proxy_);
    p.input (R"("a\")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_close_quote));
    EXPECT_EQ (p.coordinate (), (json::coord{5U, 1U}));
}